

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

void av1_get_nz_map_contexts_c
               (uint8_t *levels,int16_t *scan,uint16_t eob,TX_SIZE tx_size,TX_CLASS tx_class,
               int8_t *coeff_contexts)

{
  int coeff_idx;
  int bhl_00;
  int scan_idx;
  int iVar1;
  ushort in_DX;
  long in_RSI;
  uint8_t *in_R9;
  int pos;
  int i;
  int width;
  int bhl;
  TX_SIZE in_stack_00000030;
  int in_stack_ffffffffffffffcc;
  int width_00;
  
  coeff_idx = get_txb_bhl('\0');
  bhl_00 = get_txb_wide('\0');
  for (width_00 = 0; width_00 < (int)(uint)in_DX; width_00 = width_00 + 1) {
    scan_idx = (int)*(short *)(in_RSI + (long)width_00 * 2);
    iVar1 = get_nz_map_ctx(in_R9,coeff_idx,bhl_00,width_00,scan_idx,in_stack_ffffffffffffffcc,
                           in_stack_00000030,(TX_CLASS)scan);
    in_R9[scan_idx] = (uint8_t)iVar1;
  }
  return;
}

Assistant:

void av1_get_nz_map_contexts_c(const uint8_t *const levels,
                               const int16_t *const scan, const uint16_t eob,
                               const TX_SIZE tx_size, const TX_CLASS tx_class,
                               int8_t *const coeff_contexts) {
  const int bhl = get_txb_bhl(tx_size);
  const int width = get_txb_wide(tx_size);
  for (int i = 0; i < eob; ++i) {
    const int pos = scan[i];
    coeff_contexts[pos] = get_nz_map_ctx(levels, pos, bhl, width, i,
                                         i == eob - 1, tx_size, tx_class);
  }
}